

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode trynextip(connectdata *conn,int sockindex,int tempindex)

{
  int sock;
  bool bVar1;
  int local_2c;
  int firstfamily;
  int family;
  Curl_addrinfo *ai;
  curl_socket_t fd_to_close;
  CURLcode rc;
  int tempindex_local;
  int sockindex_local;
  connectdata *conn_local;
  
  ai._4_4_ = CURLE_COULDNT_CONNECT;
  sock = conn->tempsock[tempindex];
  conn->tempsock[tempindex] = -1;
  if (sockindex == 0) {
    _firstfamily = (Curl_addrinfo *)0x0;
    local_2c = 0;
    if (conn->tempaddr[tempindex] == (Curl_addrinfo *)0x0) {
      if (conn->tempaddr[0] != (Curl_addrinfo *)0x0) {
        local_2c = conn->tempaddr[0]->ai_family;
        _firstfamily = conn->tempaddr[0]->ai_next;
      }
    }
    else {
      local_2c = conn->tempaddr[tempindex]->ai_family;
      _firstfamily = conn->tempaddr[tempindex]->ai_next;
    }
    for (; _firstfamily != (Curl_addrinfo *)0x0; _firstfamily = _firstfamily->ai_next) {
      while( true ) {
        bVar1 = false;
        if (_firstfamily != (Curl_addrinfo *)0x0) {
          bVar1 = _firstfamily->ai_family != local_2c;
        }
        if (!bVar1) break;
        _firstfamily = _firstfamily->ai_next;
      }
      if (_firstfamily == (Curl_addrinfo *)0x0) break;
      ai._4_4_ = singleipconnect(conn,_firstfamily,conn->tempsock + tempindex);
      if (ai._4_4_ != CURLE_COULDNT_CONNECT) {
        conn->tempaddr[tempindex] = _firstfamily;
        break;
      }
    }
  }
  if (sock != -1) {
    Curl_closesocket(conn,sock);
  }
  return ai._4_4_;
}

Assistant:

static CURLcode trynextip(struct connectdata *conn,
                          int sockindex,
                          int tempindex)
{
  CURLcode rc = CURLE_COULDNT_CONNECT;

  /* First clean up after the failed socket.
     Don't close it yet to ensure that the next IP's socket gets a different
     file descriptor, which can prevent bugs when the curl_multi_socket_action
     interface is used with certain select() replacements such as kqueue. */
  curl_socket_t fd_to_close = conn->tempsock[tempindex];
  conn->tempsock[tempindex] = CURL_SOCKET_BAD;

  if(sockindex == FIRSTSOCKET) {
    Curl_addrinfo *ai = NULL;
    int family = AF_UNSPEC;

    if(conn->tempaddr[tempindex]) {
      /* find next address in the same protocol family */
      family = conn->tempaddr[tempindex]->ai_family;
      ai = conn->tempaddr[tempindex]->ai_next;
    }
    else if(conn->tempaddr[0]) {
      /* happy eyeballs - try the other protocol family */
      int firstfamily = conn->tempaddr[0]->ai_family;
#ifdef ENABLE_IPV6
      family = (firstfamily == AF_INET) ? AF_INET6 : AF_INET;
#else
      family = firstfamily;
#endif
      ai = conn->tempaddr[0]->ai_next;
    }

    while(ai) {
      while(ai && ai->ai_family != family)
        ai = ai->ai_next;

      if(ai) {
        rc = singleipconnect(conn, ai, &conn->tempsock[tempindex]);
        if(rc == CURLE_COULDNT_CONNECT) {
          ai = ai->ai_next;
          continue;
        }
        conn->tempaddr[tempindex] = ai;
      }
      break;
    }
  }

  if(fd_to_close != CURL_SOCKET_BAD)
    Curl_closesocket(conn, fd_to_close);

  return rc;
}